

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv__close_nocancel(int fd)

{
  long lVar1;
  
  lVar1 = syscall(3,fd);
  return (int)lVar1;
}

Assistant:

int uv__close_nocancel(int fd) {
#if defined(__APPLE__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wdollar-in-identifier-extension"
  extern int close$NOCANCEL(int);
  return close$NOCANCEL(fd);
#pragma GCC diagnostic pop
#elif defined(__linux__)
  return syscall(SYS_close, fd);
#else
  return close(fd);
#endif
}